

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::GenerateAccessorDeclarations
          (SingularString *this,Printer *p)

{
  FieldDescriptor *pFVar1;
  Descriptor *descriptor;
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> v_02;
  Printer *pPVar2;
  bool bVar3;
  Descriptor *this_00;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_01;
  string_view prefix;
  Sub *local_5a8;
  basic_string_view<char,_std::char_traits<char>_> local_518;
  undefined1 local_501;
  anon_class_16_2_fd512ddd_for_cb local_500;
  allocator<char> local_4e9;
  string local_4e8;
  Sub *local_4c8;
  Sub local_4c0;
  iterator local_408;
  size_type local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3f8;
  Semantic local_3e4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3e0;
  basic_string_view<char,_std::char_traits<char>_> local_3d8;
  basic_string_view<char,_std::char_traits<char>_> *local_3c8;
  undefined1 local_3c0 [8];
  FieldDescriptor *local_3b8;
  undefined1 local_3b0 [32];
  Span<google::protobuf::io::Printer::Sub_const> local_390 [16];
  undefined1 local_380 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v3;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_360;
  basic_string_view<char,_std::char_traits<char>_> local_358;
  basic_string_view<char,_std::char_traits<char>_> *local_348;
  undefined8 local_340;
  FieldDescriptor *local_338;
  pointer local_330;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_328;
  Span<const_google::protobuf::io::Printer::Sub> local_310;
  undefined1 local_300 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  undefined1 local_2d8 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_2b8;
  AnnotationRecord local_2b0;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  string local_260;
  allocator<char> local_229;
  string local_228;
  Sub local_208;
  Sub local_150;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  undefined8 local_78;
  char *pcStack_70;
  iterator local_68;
  undefined8 local_60;
  FieldDescriptor *local_58;
  pointer local_50;
  undefined1 local_48 [8];
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  vars;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularString *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar3 = protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors
                    ((this->super_FieldGeneratorBase).field_);
  pPVar2 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"\n      private:  // Hidden due to unknown ctype option.\n    ");
    protobuf::io::Printer::SourceLocation::current();
    protobuf::io::Printer::Emit(pPVar2,local_28._M_len,local_28._M_str);
  }
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  local_78 = 0xe;
  pcStack_70 = "set_allocated_";
  local_88._M_len = 0;
  local_88._M_str = anon_var_dwarf_37cdd0 + 5;
  local_68 = &local_88;
  local_60 = 2;
  v_02._M_len = 2;
  v_02._M_array = local_68;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_58,v_02);
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_90);
  prefixes.len_._0_4_ = local_90._M_payload;
  prefixes.len_._4_1_ = local_90._M_engaged;
  prefixes.len_._5_3_ = local_90._5_3_;
  prefixes.ptr_ = local_50;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_48,(cpp *)pFVar1,local_58,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"release_name",&local_229)
  ;
  this_00 = FieldDescriptor::containing_type((this->super_FieldGeneratorBase).field_);
  descriptor = (Descriptor *)(this->super_FieldGeneratorBase).field_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_270,"release_");
  prefix._M_str = (char *)in_R9;
  prefix._M_len = (size_t)local_270._M_str;
  SafeFunctionName_abi_cxx11_
            (&local_260,(cpp *)this_00,descriptor,(FieldDescriptor *)local_270._M_len,prefix);
  protobuf::io::Printer::Sub::Sub<std::__cxx11::string>(&local_208,&local_228,&local_260);
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_2b8);
  protobuf::io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::FieldDescriptor,_0>
            (&local_2b0,pFVar1,local_2b8);
  protobuf::io::Printer::Sub::AnnotatedAs(&local_150,&local_208,&local_2b0);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  push_back((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
             *)local_48,&local_150);
  protobuf::io::Printer::Sub::~Sub(&local_150);
  protobuf::io::Printer::AnnotationRecord::~AnnotationRecord(&local_2b0);
  protobuf::io::Printer::Sub::~Sub(&local_208);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  pPVar2 = local_18;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)(v2.storage_.callback_buffer_ + 8),
             (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)local_48);
  protobuf::io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_2d8,pPVar2,stack0xfffffffffffffd18);
  pPVar2 = local_18;
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_358,"set_");
  local_340 = 1;
  v_01._M_len = 1;
  v_01._M_array = &local_358;
  local_348 = &local_358;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_338,v_01);
  v3.storage_.callback_buffer_[0xc] = '\x01';
  v3.storage_.callback_buffer_[0xd] = '\0';
  v3.storage_.callback_buffer_[0xe] = '\0';
  v3.storage_.callback_buffer_[0xf] = '\0';
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            (&local_360,(Semantic *)(v3.storage_.callback_buffer_ + 0xc));
  prefixes_00.len_ =
       (size_type)
       local_360.
       super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  prefixes_00.ptr_ = local_330;
  AnnotatedAccessors(&local_328,(cpp *)pFVar1,local_338,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_310,&local_328);
  protobuf::io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_300,pPVar2,local_310);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_328);
  pPVar2 = local_18;
  pFVar1 = (this->super_FieldGeneratorBase).field_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3d8,"mutable_");
  local_3c0 = (undefined1  [8])0x1;
  v_00._M_len = 1;
  v_00._M_array = &local_3d8;
  local_3c8 = &local_3d8;
  absl::lts_20250127::Span<std::basic_string_view<char,std::char_traits<char>>const>::
  Span<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>const>
            ((Span<std::basic_string_view<char,std::char_traits<char>>const> *)&local_3b8,v_00);
  local_3e4 = kAlias;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_3e0,&local_3e4);
  prefixes_01.len_ =
       (size_type)
       local_3e0.
       super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>.
       _M_payload.super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>;
  prefixes_01.ptr_ = (pointer)local_3b0._0_8_;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)(local_3b0 + 8),(cpp *)pFVar1,local_3b8,prefixes_01,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            (local_390,
             (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)(local_3b0 + 8));
  protobuf::io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_380,pPVar2,(Span<const_google::protobuf::io::Printer::Sub>)local_390);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)(local_3b0 + 8));
  pPVar2 = local_18;
  local_501 = 1;
  local_4c8 = &local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"donated",&local_4e9);
  local_500.p = &local_18;
  local_500.this = this;
  protobuf::io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::SingularString::GenerateAccessorDeclarations(google::protobuf::io::Printer*)const::__0>
            (&local_4c0,&local_4e8,&local_500);
  local_501 = 0;
  local_408 = &local_4c0;
  local_400 = 1;
  v._M_len = 1;
  v._M_array = local_408;
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_3f8._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_518,
             "\n            $DEPRECATED$ const ::std::string& $name$() const;\n            //~ Using `Arg_ = const std::string&` will make the type of `arg`\n            //~ default to `const std::string&`, due to reference collapse. This\n            //~ is necessary because there are a handful of users that rely on\n            //~ this default.\n            template <typename Arg_ = const ::std::string&, typename... Args_>\n            $DEPRECATED$ void $set_name$(Arg_&& arg, Args_... args);\n            $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$();\n            $DEPRECATED$ [[nodiscard]] ::std::string* $nullable$ $release_name$();\n            $DEPRECATED$ void $set_allocated_name$(::std::string* $nullable$ value);\n\n            private:\n            const ::std::string& _internal_$name$() const;\n            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const ::std::string& value);\n            ::std::string* $nonnull$ _internal_mutable_$name$();\n            $donated$;\n\n            public:\n          "
            );
  protobuf::io::Printer::SourceLocation::current();
  protobuf::io::Printer::Emit
            (pPVar2,local_3f8._M_allocated_capacity,local_3f8._8_8_,local_518._M_len,
             local_518._M_str);
  local_5a8 = (Sub *)&local_408;
  do {
    local_5a8 = local_5a8 + -1;
    protobuf::io::Printer::Sub::~Sub(local_5a8);
  } while (local_5a8 != &local_4c0);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_380);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_300);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_2d8);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_48);
  return;
}

Assistant:

void SingularString::GenerateAccessorDeclarations(io::Printer* p) const {
  // If we're using SingularString for a field with a ctype, it's
  // because that ctype isn't actually implemented.  In particular, this is
  // true of ctype=CORD and ctype=STRING_PIECE in the open source release.
  // We aren't releasing Cord because it has too many Google-specific
  // dependencies and we aren't releasing StringPiece because it's hardly
  // useful outside of Google and because it would get confusing to have
  // multiple instances of the StringPiece class in different libraries (PCRE
  // already includes it for their C++ bindings, which came from Google).
  //
  // In any case, we make all the accessors private while still actually
  // using a string to represent the field internally.  This way, we can
  // guarantee that if we do ever implement the ctype, it won't break any
  // existing users who might be -- for whatever reason -- already using .proto
  // files that applied the ctype.  The field can still be accessed via the
  // reflection interface since the reflection interface is independent of
  // the string's underlying representation.
  if (internal::cpp::IsStringFieldWithPrivatizedAccessors(*field_)) {
    p->Emit(R"cc(
      private:  // Hidden due to unknown ctype option.
    )cc");
  }

  auto vars = AnnotatedAccessors(field_, {"", "set_allocated_"});
  vars.push_back(Sub{
      "release_name",
      SafeFunctionName(field_->containing_type(), field_, "release_"),
  }
                     .AnnotatedAs(field_));
  auto v1 = p->WithVars(vars);
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));
  auto v3 = p->WithVars(
      AnnotatedAccessors(field_, {"mutable_"}, AnnotationCollector::kAlias));

  p->Emit({{"donated",
            [&] {
              if (!is_inlined()) return;
              p->Emit(R"cc(
                PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
              )cc");
            }}},
          R"cc(
            $DEPRECATED$ const ::std::string& $name$() const;
            //~ Using `Arg_ = const std::string&` will make the type of `arg`
            //~ default to `const std::string&`, due to reference collapse. This
            //~ is necessary because there are a handful of users that rely on
            //~ this default.
            template <typename Arg_ = const ::std::string&, typename... Args_>
            $DEPRECATED$ void $set_name$(Arg_&& arg, Args_... args);
            $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$();
            $DEPRECATED$ [[nodiscard]] ::std::string* $nullable$ $release_name$();
            $DEPRECATED$ void $set_allocated_name$(::std::string* $nullable$ value);

            private:
            const ::std::string& _internal_$name$() const;
            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const ::std::string& value);
            ::std::string* $nonnull$ _internal_mutable_$name$();
            $donated$;

            public:
          )cc");
}